

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialogPrivate::retranslateStrings(QProgressDialogPrivate *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->useDefaultCancelText == true) {
    QProgressDialog::tr((QString *)&local_30,"Cancel",(char *)0x0,-1);
    setCancelButtonText(this,(QString *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::retranslateStrings()
{
    if (useDefaultCancelText)
        setCancelButtonText(QProgressDialog::tr("Cancel"));
}